

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primecandidate.c
# Opt level: O3

void pcs_free(PrimeCandidateSource *s)

{
  ulong uVar1;
  
  mp_free(s->limit);
  mp_free(s->factor);
  mp_free(s->addend);
  if (s->nkps != 0) {
    uVar1 = 0;
    do {
      mp_free(s->kps[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < s->nkps);
  }
  safefree(s->avoids);
  safefree(s->kps);
  safefree(s);
  return;
}

Assistant:

void pcs_free(PrimeCandidateSource *s)
{
    mp_free(s->limit);
    mp_free(s->factor);
    mp_free(s->addend);
    for (size_t i = 0; i < s->nkps; i++)
        mp_free(s->kps[i]);
    sfree(s->avoids);
    sfree(s->kps);
    sfree(s);
}